

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorclock.h
# Opt level: O0

Clock __thiscall
VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::get_clock_by_tid
          (VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *this,
          TID tid)

{
  bool bVar1;
  pointer ppVar2;
  iterator local_40;
  undefined1 local_30 [8];
  const_iterator it;
  TID tid_local;
  VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *this_local;
  
  it.inner_.field_1._4_4_ = tid;
  _local_30 = (iterator)
              phmap::container_internal::
              raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
              ::find<unsigned_int>
                        ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                          *)this,(key_arg<unsigned_int> *)((long)&it.inner_.field_1 + 4));
  local_40 = (iterator)
             phmap::container_internal::
             raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
             ::end((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                    *)this);
  bVar1 = phmap::container_internal::operator!=
                    ((const_iterator *)local_30,(const_iterator *)&local_40);
  if (bVar1) {
    ppVar2 = phmap::container_internal::
             raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
             ::const_iterator::operator->((const_iterator *)local_30);
    this_local._4_4_ = make_clock(ppVar2->second);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

Clock get_clock_by_tid(TID tid) const {
    auto it = vc.find(tid);
    if (it != vc.end()) {
      return make_clock(it->second);
    } else {
      return 0;
    }
  }